

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O3

shared_ptr<LNode> __thiscall LParser::reduce_19(LParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  size_type *this_03;
  long in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<LNode> sVar5;
  shared_ptr<LNode> local_90;
  shared_ptr<LNode> local_80;
  shared_ptr<LNode> local_70;
  LNodeExpr local_60;
  
  lVar2 = *(long *)(in_RSI + 0x30);
  lVar3 = *(long *)(in_RSI + 0x38);
  local_80.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar3 + -0x30);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + -0x28);
  lVar3 = lVar3 - lVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      lVar2 = *(long *)(in_RSI + 0x30);
      lVar3 = *(long *)(in_RSI + 0x38) - lVar2;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_70.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar2 + -0x20 + lVar3);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + -0x18 + lVar3);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
      lVar2 = *(long *)(in_RSI + 0x30);
      lVar3 = *(long *)(in_RSI + 0x38) - lVar2;
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_90.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar2 + -0x10 + lVar3);
  this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + -8 + lVar3);
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  local_90.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
  local_80.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  local_70.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_01;
  LNodeExpr::LNodeExpr(&local_60,&local_70,&local_80,&local_90);
  peVar1 = (element_type *)operator_new(0x50);
  (peVar1->token)._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined ***)peVar1 = &PTR___Sp_counted_ptr_inplace_001218f0;
  this_03 = &(peVar1->token)._M_string_length;
  LNodeData<LNodeExpr>::LNodeData((LNodeData<LNodeExpr> *)this_03,Expr,&local_60);
  _Var4._M_pi = extraout_RDX;
  if (local_60.r.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.r.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_60.l.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.l.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  if (local_60.op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.op.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_02;
  }
  if (local_90.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_03;
  }
  if (local_80.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_70.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_05;
  }
  (this->lexer)._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
  super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl = (LLexer *)this_03;
  (this->peek).super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var4._M_pi = extraout_RDX_07;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_08;
  }
  sVar5.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar5.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_19() {
    // Expr : Expr1 BinOP2 Expr
    auto expr1 = this->get_node(3);
    auto op = this->get_node(2);
    auto expr = this->get_node(1);
    auto r = std::make_shared<LNodeData<LNodeExpr>>(LNodeType::Expr, LNodeExpr(op, expr1, expr));
    return r;
}